

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::ByteSize(Extension *this,int number)

{
  FieldType FVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int in_ESI;
  undefined8 *in_RDI;
  size_t size;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  size_t tag_size;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  size_t result;
  FieldType in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  LogMessage *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe54;
  FieldType type;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  size_t local_18;
  
  type = (FieldType)((uint)in_stack_fffffffffffffe54 >> 0x18);
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_18 = 0;
  if ((*(byte *)((long)in_RDI + 9) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 10) & 1) == 0) {
      anon_unknown_19::real_type(type);
      local_18 = WireFormatLite::TagSize(in_ESI,in_stack_fffffffffffffdf8);
      FVar1 = anon_unknown_19::real_type(type);
      switch(FVar1) {
      case TYPE_DOUBLE:
        local_18 = local_18 + 8;
        break;
      case TYPE_FLOAT:
        local_18 = local_18 + 4;
        break;
      case TYPE_INT64:
        sVar4 = WireFormatLite::Int64Size(0x49d479);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_UINT64:
        sVar4 = WireFormatLite::UInt64Size(0x49d4c2);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_INT32:
        sVar4 = WireFormatLite::Int32Size(0);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_FIXED64:
        local_18 = local_18 + 8;
        break;
      case TYPE_FIXED32:
        local_18 = local_18 + 4;
        break;
      case TYPE_BOOL:
        local_18 = local_18 + 1;
        break;
      case TYPE_STRING:
        sVar4 = WireFormatLite::StringSize((string *)0x49d530);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_GROUP:
        sVar4 = WireFormatLite::GroupSize<google::protobuf::MessageLite>((MessageLite *)0x49d59e);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_MESSAGE:
        if ((*(byte *)((long)in_RDI + 10) >> 4 & 1) == 0) {
          sVar4 = WireFormatLite::MessageSize<google::protobuf::MessageLite>
                            ((MessageLite *)0x49d619);
        }
        else {
          iVar2 = (**(code **)(*(long *)*in_RDI + 0x50))();
          sVar4 = io::CodedOutputStream::VarintSize32(0);
          sVar4 = sVar4 + (long)iVar2;
        }
        local_18 = sVar4 + local_18;
        break;
      case TYPE_BYTES:
        sVar4 = WireFormatLite::BytesSize((string *)0x49d555);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_UINT32:
        sVar4 = WireFormatLite::UInt32Size(0);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_ENUM:
        sVar4 = WireFormatLite::EnumSize(0);
        local_18 = sVar4 + local_18;
        break;
      case TYPE_SFIXED32:
        local_18 = local_18 + 4;
        break;
      case TYPE_SFIXED64:
        local_18 = local_18 + 8;
        break;
      case TYPE_SINT32:
        sVar4 = WireFormatLite::SInt32Size(0);
        local_18 = sVar4 + local_18;
        break;
      case MAX_FIELD_TYPE:
        sVar4 = WireFormatLite::SInt64Size(0x49d50b);
        local_18 = sVar4 + local_18;
      }
    }
  }
  else if ((*(byte *)((long)in_RDI + 0xb) & 1) == 0) {
    anon_unknown_19::real_type(type);
    sVar4 = WireFormatLite::TagSize(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
    FVar1 = anon_unknown_19::real_type(type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      lVar6 = sVar4 + 8;
      iVar2 = RepeatedField<double>::size((RepeatedField<double> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = lVar6 * local_18;
      break;
    case TYPE_FLOAT:
      iVar2 = RepeatedField<float>::size((RepeatedField<float> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = (sVar4 + 4) * local_18;
      break;
    case TYPE_INT64:
      iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_90 = 0; iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI),
          local_90 < iVar2; local_90 = local_90 + 1) {
        RepeatedField<long>::Get
                  ((RepeatedField<long> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::Int64Size(0x49cae7);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_UINT64:
      iVar2 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      local_98 = 0;
      while (iVar2 = local_98,
            iVar3 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)*in_RDI),
            iVar2 < iVar3) {
        RepeatedField<unsigned_long>::Get
                  ((RepeatedField<unsigned_long> *)CONCAT44(iVar2,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::UInt64Size(0x49cc6c);
        local_18 = sVar4 + local_18;
        local_98 = local_98 + 1;
      }
      break;
    case TYPE_INT32:
      iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_8c = 0; iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI),
          local_8c < iVar2; local_8c = local_8c + 1) {
        RepeatedField<int>::Get
                  ((RepeatedField<int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::Int32Size(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_FIXED64:
      iVar2 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = (sVar4 + 8) * local_18;
      break;
    case TYPE_FIXED32:
      iVar2 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = (sVar4 + 4) * local_18;
      break;
    case TYPE_BOOL:
      lVar6 = sVar4 + 1;
      iVar2 = RepeatedField<bool>::size((RepeatedField<bool> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = lVar6 * local_18;
      break;
    case TYPE_STRING:
      iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x49ce39);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_a4 = 0;
          iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x49ce88), local_a4 < iVar2; local_a4 = local_a4 + 1) {
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        sVar4 = WireFormatLite::StringSize((string *)0x49ceb4);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_GROUP:
      iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((RepeatedPtrField<google::protobuf::MessageLite> *)0x49d06c);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      local_b0 = 0;
      while (iVar2 = local_b0,
            iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                              ((RepeatedPtrField<google::protobuf::MessageLite> *)0x49d0b5),
            iVar2 < iVar3) {
        RepeatedPtrField<google::protobuf::MessageLite>::Get
                  ((RepeatedPtrField<google::protobuf::MessageLite> *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdfc);
        sVar4 = WireFormatLite::GroupSize<google::protobuf::MessageLite>((MessageLite *)0x49d0de);
        local_18 = sVar4 + local_18;
        local_b0 = local_b0 + 1;
      }
      break;
    case TYPE_MESSAGE:
      iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                        ((RepeatedPtrField<google::protobuf::MessageLite> *)0x49d123);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_b4 = 0;
          iVar2 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)0x49d16c),
          local_b4 < iVar2; local_b4 = local_b4 + 1) {
        RepeatedPtrField<google::protobuf::MessageLite>::Get
                  ((RepeatedPtrField<google::protobuf::MessageLite> *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdfc);
        sVar4 = WireFormatLite::MessageSize<google::protobuf::MessageLite>((MessageLite *)0x49d195);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_BYTES:
      iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x49cefc);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_a8 = 0;
          iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x49cf48), local_a8 < iVar2; local_a8 = local_a8 + 1) {
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        sVar4 = WireFormatLite::BytesSize((string *)0x49cf71);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_UINT32:
      iVar2 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_94 = 0;
          iVar2 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)*in_RDI),
          local_94 < iVar2; local_94 = local_94 + 1) {
        RepeatedField<unsigned_int>::Get
                  ((RepeatedField<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::UInt32Size(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_ENUM:
      iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_ac = 0; iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI),
          local_ac < iVar2; local_ac = local_ac + 1) {
        RepeatedField<int>::Get
                  ((RepeatedField<int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::EnumSize(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_SFIXED32:
      iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = (sVar4 + 4) * local_18;
      break;
    case TYPE_SFIXED64:
      iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = (sVar4 + 8) * local_18;
      break;
    case TYPE_SINT32:
      iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_9c = 0; iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI),
          local_9c < iVar2; local_9c = local_9c + 1) {
        RepeatedField<int>::Get
                  ((RepeatedField<int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)(sVar4 >> 0x20));
        sVar5 = WireFormatLite::SInt32Size(0);
        local_18 = sVar5 + local_18;
      }
      break;
    case MAX_FIELD_TYPE:
      iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = sVar4 * local_18;
      for (local_a0 = 0; iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI),
          local_a0 < iVar2; local_a0 = local_a0 + 1) {
        RepeatedField<long>::Get
                  ((RepeatedField<long> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::SInt64Size(0x49cdf1);
        local_18 = sVar4 + local_18;
      }
    }
  }
  else {
    FVar1 = anon_unknown_19::real_type(type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      iVar2 = RepeatedField<double>::size((RepeatedField<double> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = local_18 * 8;
      break;
    case TYPE_FLOAT:
      iVar2 = RepeatedField<float>::size((RepeatedField<float> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = local_18 * 4;
      break;
    case TYPE_INT64:
      for (local_20 = 0; iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI),
          local_20 < iVar2; local_20 = local_20 + 1) {
        RepeatedField<long>::Get
                  ((RepeatedField<long> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::Int64Size(0x49c42d);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_UINT64:
      for (local_28 = 0;
          iVar2 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)*in_RDI),
          local_28 < iVar2; local_28 = local_28 + 1) {
        RepeatedField<unsigned_long>::Get
                  ((RepeatedField<unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::UInt64Size(0x49c526);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_INT32:
      for (local_1c = 0; iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI),
          local_1c < iVar2; local_1c = local_1c + 1) {
        RepeatedField<int>::Get
                  ((RepeatedField<int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::Int32Size(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_FIXED64:
      iVar2 = RepeatedField<unsigned_long>::size((RepeatedField<unsigned_long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = local_18 * 8;
      break;
    case TYPE_FIXED32:
      iVar2 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = local_18 * 4;
      break;
    case TYPE_BOOL:
      iVar2 = RepeatedField<bool>::size((RepeatedField<bool> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (in_stack_fffffffffffffe10,level,(char *)in_stack_fffffffffffffe00,
                 in_stack_fffffffffffffdfc);
      LogMessage::operator<<
                (in_stack_fffffffffffffe00,
                 (char *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffe00,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      LogMessage::~LogMessage((LogMessage *)0x49c87b);
      break;
    case TYPE_UINT32:
      for (local_24 = 0;
          iVar2 = RepeatedField<unsigned_int>::size((RepeatedField<unsigned_int> *)*in_RDI),
          local_24 < iVar2; local_24 = local_24 + 1) {
        RepeatedField<unsigned_int>::Get
                  ((RepeatedField<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::UInt32Size(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_ENUM:
      for (local_34 = 0; iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI),
          local_34 < iVar2; local_34 = local_34 + 1) {
        RepeatedField<int>::Get
                  ((RepeatedField<int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::EnumSize(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case TYPE_SFIXED32:
      iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = local_18 * 4;
      break;
    case TYPE_SFIXED64:
      iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI);
      local_18 = FromIntSize(iVar2);
      local_18 = local_18 * 8;
      break;
    case TYPE_SINT32:
      for (local_2c = 0; iVar2 = RepeatedField<int>::size((RepeatedField<int> *)*in_RDI),
          local_2c < iVar2; local_2c = local_2c + 1) {
        RepeatedField<int>::Get
                  ((RepeatedField<int> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::SInt32Size(0);
        local_18 = sVar4 + local_18;
      }
      break;
    case MAX_FIELD_TYPE:
      for (local_30 = 0; iVar2 = RepeatedField<long>::size((RepeatedField<long> *)*in_RDI),
          local_30 < iVar2; local_30 = local_30 + 1) {
        RepeatedField<long>::Get
                  ((RepeatedField<long> *)
                   CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        sVar4 = WireFormatLite::SInt64Size(0x49c61f);
        local_18 = sVar4 + local_18;
      }
    }
    iVar2 = ToCachedSize(local_18);
    *(int *)((long)in_RDI + 0xc) = iVar2;
    if (local_18 != 0) {
      sVar4 = io::CodedOutputStream::VarintSize32(0);
      WireFormatLite::MakeTag(in_ESI,WIRETYPE_LENGTH_DELIMITED);
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      local_18 = sVar5 + sVar4 + local_18;
    }
  }
  return local_18;
}

Assistant:

size_t ExtensionSet::Extension::ByteSize(int number) const {
  size_t result = 0;

  if (is_repeated) {
    if (is_packed) {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                 \
  case WireFormatLite::TYPE_##UPPERCASE:                             \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) { \
      result += WireFormatLite::CAMELCASE##Size(                     \
          repeated_##LOWERCASE##_value->Get(i));                     \
    }                                                                \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += WireFormatLite::k##CAMELCASE##Size *               \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }

      cached_size = ToCachedSize(result);
      if (result > 0) {
        result += io::CodedOutputStream::VarintSize32(result);
        result += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
      }
    } else {
      size_t tag_size = WireFormatLite::TagSize(number, real_type(type));

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    result += tag_size * FromIntSize(repeated_##LOWERCASE##_value->size()); \
    for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {        \
      result += WireFormatLite::CAMELCASE##Size(                            \
          repeated_##LOWERCASE##_value->Get(i));                            \
    }                                                                       \
    break

        HANDLE_TYPE(INT32, Int32, int32);
        HANDLE_TYPE(INT64, Int64, int64);
        HANDLE_TYPE(UINT32, UInt32, uint32);
        HANDLE_TYPE(UINT64, UInt64, uint64);
        HANDLE_TYPE(SINT32, SInt32, int32);
        HANDLE_TYPE(SINT64, SInt64, int64);
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
        HANDLE_TYPE(ENUM, Enum, enum);
        HANDLE_TYPE(GROUP, Group, message);
        HANDLE_TYPE(MESSAGE, Message, message);
#undef HANDLE_TYPE

        // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)             \
  case WireFormatLite::TYPE_##UPPERCASE:                         \
    result += (tag_size + WireFormatLite::k##CAMELCASE##Size) *  \
              FromIntSize(repeated_##LOWERCASE##_value->size()); \
    break
        HANDLE_TYPE(FIXED32, Fixed32, uint32);
        HANDLE_TYPE(FIXED64, Fixed64, uint64);
        HANDLE_TYPE(SFIXED32, SFixed32, int32);
        HANDLE_TYPE(SFIXED64, SFixed64, int64);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    result += WireFormatLite::TagSize(number, real_type(type));
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)      \
  case WireFormatLite::TYPE_##UPPERCASE:                  \
    result += WireFormatLite::CAMELCASE##Size(LOWERCASE); \
    break

      HANDLE_TYPE(INT32, Int32, int32_value);
      HANDLE_TYPE(INT64, Int64, int64_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_value);
      HANDLE_TYPE(SINT32, SInt32, int32_value);
      HANDLE_TYPE(SINT64, SInt64, int64_value);
      HANDLE_TYPE(STRING, String, *string_value);
      HANDLE_TYPE(BYTES, Bytes, *string_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
      HANDLE_TYPE(GROUP, Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE: {
        if (is_lazy) {
          size_t size = lazymessage_value->ByteSize();
          result += io::CodedOutputStream::VarintSize32(size) + size;
        } else {
          result += WireFormatLite::MessageSize(*message_value);
        }
        break;
      }

      // Stuff with fixed size.
#define HANDLE_TYPE(UPPERCASE, CAMELCASE)         \
  case WireFormatLite::TYPE_##UPPERCASE:          \
    result += WireFormatLite::k##CAMELCASE##Size; \
    break
        HANDLE_TYPE(FIXED32, Fixed32);
        HANDLE_TYPE(FIXED64, Fixed64);
        HANDLE_TYPE(SFIXED32, SFixed32);
        HANDLE_TYPE(SFIXED64, SFixed64);
        HANDLE_TYPE(FLOAT, Float);
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE
    }
  }

  return result;
}